

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baggage_types.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::BaggageRestriction::read
          (BaggageRestriction *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  TProtocolException *pTVar5;
  undefined4 in_register_00000034;
  bool isset_maxValueLength;
  bool isset_baggageKey;
  short local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  BaggageRestriction *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar3 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
  bVar1 = false;
  bVar2 = false;
  while( true ) {
    uVar3 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    if (local_4e == 1) {
      if (local_4c == T_STRING) {
        uVar3 = apache::thrift::protocol::TProtocol::readString(tracker.prot_,&this->baggageKey);
        fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
        bVar1 = true;
      }
      else {
        uVar3 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
      }
    }
    else if (local_4e == 2) {
      if (local_4c == T_I32) {
        uVar3 = apache::thrift::protocol::TProtocol::readI32(tracker.prot_,&this->maxValueLength);
        fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
        bVar2 = true;
      }
      else {
        uVar3 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
      }
    }
    else {
      uVar3 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
    }
    uVar3 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar3 + fname.field_2._12_4_;
  }
  uVar3 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar4 = uVar3 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar4;
  if (bVar1) {
    if (bVar2) {
      std::__cxx11::string::~string((string *)local_48);
      apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
                ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
      return (ulong)uVar4;
    }
    pTVar5 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(pTVar5,INVALID_DATA);
    __cxa_throw(pTVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  pTVar5 = (TProtocolException *)__cxa_allocate_exception(0x30);
  apache::thrift::protocol::TProtocolException::TProtocolException(pTVar5,INVALID_DATA);
  __cxa_throw(pTVar5,&apache::thrift::protocol::TProtocolException::typeinfo,
              apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t BaggageRestriction::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_baggageKey = false;
  bool isset_maxValueLength = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->baggageKey);
          isset_baggageKey = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->maxValueLength);
          isset_maxValueLength = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_baggageKey)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_maxValueLength)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}